

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  byte bVar1;
  MessageOptions *pMVar2;
  FileOptions *pFVar3;
  FileDescriptor *pFVar4;
  ushort *puVar5;
  ExtensionRangeOptions *pEVar6;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view declared_type_name;
  int iVar7;
  Descriptor *pDVar8;
  FieldOptions *pFVar9;
  void *pvVar10;
  Rep *pRVar11;
  bool bVar12;
  FieldDescriptorProto *in_RCX;
  ulong uVar13;
  void **ppvVar14;
  undefined8 *puVar15;
  char *pcVar16;
  undefined8 *puVar17;
  DescriptorBuilder *__s;
  ExtensionRangeOptions **ppEVar18;
  DescriptorBuilder *this_00;
  ErrorLocation location;
  char *error;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *pRVar19;
  size_type __rlen;
  Tables *__n;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *this_01;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  string_view message_name;
  string_view element_name_07;
  string_view input;
  string_view declared_full_name;
  code *pcVar20;
  __atomic_base<long> local_98;
  _Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
  local_90;
  DescriptorBuilder *local_88;
  undefined1 local_80 [40];
  code *pcStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  code *pcStack_38;
  
  local_98._M_i = (__int_type_conflict)field;
  if (this->pool_->lazily_build_dependencies_ == true) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    pDVar8 = FieldDescriptor::message_type(field);
    if (pDVar8 == (Descriptor *)0x0) {
      return;
    }
  }
  ValidateFieldFeatures(this,field,proto);
  if ((1000 < (int)field->file_->edition_) && ((~field->field_0x3 & 6) != 0)) {
    pcVar16 = (field->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name._M_str = pcVar16 + ~element_name._M_len;
    in_RCX = proto;
    AddError(this,element_name,&proto->super_Message,TYPE,
             "ctype option is not allowed under edition 2024 and beyond. Use the feature string_type = VIEW|CORD|STRING|... instead."
            );
  }
  pFVar9 = field->options_;
  if ((((pFVar9->field_0)._impl_.lazy_ != false) ||
      ((pFVar9->field_0)._impl_.unverified_lazy_ == true)) && (field->type_ != '\v')) {
    pcVar16 = (field->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_00._M_str = pcVar16 + ~element_name_00._M_len;
    in_RCX = proto;
    AddError(this,element_name_00,&proto->super_Message,TYPE,
             "[lazy = true] can only be specified for submessage fields.");
    pFVar9 = field->options_;
  }
  if ((pFVar9->field_0)._impl_.packed_ == true) {
    bVar1 = field->field_0x1;
    uVar13 = CONCAT71((int7)((ulong)pFVar9 >> 8),bVar1) & 0xffffff20;
    bVar12 = (bool)((byte)uVar13 >> 5);
    in_RCX = (FieldDescriptorProto *)CONCAT71((int7)(uVar13 >> 8),bVar12);
    if (0xbf < bVar1 != bVar12) {
      ValidateOptions();
      goto LAB_00225b12;
    }
    if (((bVar1 & 0x20) == 0) || (0xfffffffb < field->type_ - 0xd)) {
      pcVar16 = (field->all_names_).payload_;
      element_name_01._M_len = (ulong)*(ushort *)(pcVar16 + 2);
      element_name_01._M_str = pcVar16 + ~element_name_01._M_len;
      in_RCX = proto;
      AddError(this,element_name_01,&proto->super_Message,TYPE,
               "[packed = true] can only be specified for repeated primitive fields.");
    }
  }
  if (((field->containing_type_ != (Descriptor *)0x0) &&
      (pMVar2 = field->containing_type_->options_,
      pMVar2 != (MessageOptions *)_MessageOptions_default_instance_)) &&
     ((pMVar2->field_0)._impl_.message_set_wire_format_ == true)) {
    bVar1 = field->field_0x1;
    if ((bVar1 & 8) == 0) {
      pcVar16 = (field->all_names_).payload_;
      uVar13 = (ulong)*(ushort *)(pcVar16 + 2);
      pcVar16 = pcVar16 + ~uVar13;
      error = "MessageSets cannot have fields, only extensions.";
      location = NAME;
    }
    else {
      if ((field->merged_features_->field_0)._impl_.field_presence_ != 3) {
        uVar13 = CONCAT71((int7)((ulong)pMVar2 >> 8),bVar1) & 0xffffff20;
        bVar12 = (bool)((byte)uVar13 >> 5);
        in_RCX = (FieldDescriptorProto *)CONCAT71((int7)(uVar13 >> 8),bVar12);
        if (0xbf < bVar1 != bVar12) {
LAB_00225b12:
          ValidateOptions();
        }
        if (((bVar1 & 0x20) == 0) && (field->type_ == '\v')) goto LAB_00225732;
      }
      pcVar16 = (field->all_names_).payload_;
      uVar13 = (ulong)*(ushort *)(pcVar16 + 2);
      pcVar16 = pcVar16 + ~uVar13;
      error = "Extensions of MessageSets must be optional messages.";
      location = TYPE;
    }
    element_name_02._M_str = pcVar16;
    element_name_02._M_len = uVar13;
    in_RCX = proto;
    AddError(this,element_name_02,&proto->super_Message,location,error);
  }
LAB_00225732:
  if (((((field->file_ != (FileDescriptor *)0x0) &&
        (pFVar3 = field->file_->options_, pFVar3 != (FileOptions *)_FileOptions_default_instance_))
       && ((pFVar3->field_0)._impl_.optimize_for_ == 3)) &&
      (field->containing_type_ != (Descriptor *)0x0)) &&
     (((pFVar4 = field->containing_type_->file_, pFVar4 == (FileDescriptor *)0x0 ||
       (pFVar3 = pFVar4->options_, pFVar3 == (FileOptions *)_FileOptions_default_instance_)) ||
      ((pFVar3->field_0)._impl_.optimize_for_ != 3)))) {
    pcVar16 = (field->all_names_).payload_;
    element_name_03._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_03._M_str = pcVar16 + ~element_name_03._M_len;
    in_RCX = proto;
    AddError(this,element_name_03,&proto->super_Message,EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
            );
  }
  if (((field->type_ == '\v') &&
      (pDVar8 = FieldDescriptor::message_type(field),
      (pDVar8->options_->field_0)._impl_.map_entry_ == true)) &&
     (bVar12 = ValidateMapEntry(this,field,proto), !bVar12)) {
    pcVar16 = (field->all_names_).payload_;
    element_name_04._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_04._M_str = pcVar16 + ~element_name_04._M_len;
    in_RCX = proto;
    AddError(this,element_name_04,&proto->super_Message,TYPE,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
  }
  this_00 = this;
  ValidateJSType(this,field,proto);
  if ((~field->field_0x1 & 0xc) != 0) goto LAB_002258cb;
  puVar5 = (ushort *)(field->all_names_).payload_;
  local_90._M_head_impl =
       (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
        *)(ulong)puVar5[6];
  __n = (Tables *)(ulong)puVar5[7];
  input._M_len = (long)puVar5 + ~(ulong)*puVar5;
  this_00 = (DescriptorBuilder *)local_80;
  input._M_str = (char *)in_RCX;
  local_88 = this;
  protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
            ((string *)this_00,(_anonymous_namespace_ *)(ulong)*puVar5,input);
  bVar12 = true;
  if ((Tables *)local_80._8_8_ == __n) {
    if (__n != (Tables *)0x0) {
      this_00 = (DescriptorBuilder *)((long)puVar5 - (long)local_90._M_head_impl);
      iVar7 = bcmp(this_00,(void *)local_80._0_8_,(size_t)__n);
      if (iVar7 != 0) goto LAB_00225879;
    }
    bVar12 = false;
  }
LAB_00225879:
  if ((DescriptorBuilder *)local_80._0_8_ != (DescriptorBuilder *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,(ulong)((char *)local_80._16_8_ + 1));
    this_00 = (DescriptorBuilder *)local_80._0_8_;
  }
  this = local_88;
  if (bVar12) {
    pcVar16 = (field->all_names_).payload_;
    element_name_05._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_05._M_str = pcVar16 + ~element_name_05._M_len;
    this_00 = local_88;
    AddError(local_88,element_name_05,&proto->super_Message,OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }
LAB_002258cb:
  pcVar16 = (field->all_names_).payload_;
  if ((ulong)*(ushort *)(pcVar16 + 0xe) != 0) {
    __s = (DescriptorBuilder *)(pcVar16 + -(ulong)*(ushort *)(pcVar16 + 0xc));
    this_00 = __s;
    pvVar10 = memchr(__s,0,(ulong)*(ushort *)(pcVar16 + 0xe));
    if ((long)pvVar10 - (long)__s != -1 && pvVar10 != (void *)0x0) {
      element_name_06._M_len = (ulong)*(ushort *)(pcVar16 + 2);
      element_name_06._M_str = pcVar16 + ~element_name_06._M_len;
      this_00 = this;
      AddError(this,element_name_06,&proto->super_Message,OPTION_NAME,
               "json_name cannot have embedded null characters.");
    }
  }
  if (((field->field_0x1 & 8) != 0) &&
     (pcVar16 = (field->containing_type_->all_names_).payload_,
     message_name._M_len = (ulong)*(ushort *)(pcVar16 + 2),
     message_name._M_str = pcVar16 + ~message_name._M_len,
     bVar12 = DescriptorPool::IsReadyForCheckingDescriptorExtDecl
                        ((DescriptorPool *)this_00,message_name), !bVar12)) {
    for (ppEVar18 = &field->containing_type_->extension_ranges_->options_;
        (field->number_ < ((ExtensionRange *)(ppEVar18 + -1))->start_ ||
        (*(int *)((long)ppEVar18 + -4) <= field->number_)); ppEVar18 = ppEVar18 + 5) {
    }
    pEVar6 = *ppEVar18;
    if ((pEVar6 != (ExtensionRangeOptions *)0x0) &&
       ((byte)(this->pool_->enforce_extension_declarations_ - kCustomExtensions) < 2)) {
      this_01 = &(pEVar6->field_0)._impl_.declaration_;
      pRVar19 = this_01;
      if ((*(byte *)((long)&pEVar6->field_0 + 0x20) & 1) != 0) {
        pRVar11 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
        pRVar19 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                  pRVar11->elements;
        if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar11 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
          this_01 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                    pRVar11->elements;
        }
      }
      ppvVar14 = &(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                 *(int *)((long)&pEVar6->field_0 + 0x28);
      if (pRVar19 !=
          (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)ppvVar14) {
        do {
          pvVar10 = (pRVar19->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          if (*(int *)((long)pvVar10 + 0x28) == field->number_) {
            if (*(char *)((long)pvVar10 + 0x2c) != '\x01') {
              puVar15 = (undefined8 *)(*(ulong *)((long)pvVar10 + 0x18) & 0xfffffffffffffffc);
              puVar17 = (undefined8 *)(*(ulong *)((long)pvVar10 + 0x20) & 0xfffffffffffffffc);
              uStack_48 = *puVar17;
              local_50 = puVar17[1];
              declared_type_name._M_str = (char *)uStack_48;
              declared_type_name._M_len = local_50;
              declared_full_name._M_str = (char *)*puVar15;
              declared_full_name._M_len = puVar15[1];
              CheckExtensionDeclaration
                        (this,field,proto,declared_full_name,declared_type_name,
                         *(bool *)((long)pvVar10 + 0x2d));
              return;
            }
            pcVar16 = (field->all_names_).payload_;
            uVar13 = (ulong)*(ushort *)(pcVar16 + 2);
            pcVar16 = pcVar16 + ~uVar13;
            local_40 = local_80;
            pcStack_38 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
            ;
            pcVar20 = absl::lts_20250127::functional_internal::
                      InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
            ;
            goto LAB_00225a90;
          }
          pRVar19 = (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)
                    &(pRVar19->super_RepeatedPtrFieldBase).current_size_;
        } while (pRVar19 !=
                 (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)ppvVar14);
      }
      if ((*(int *)((long)&(*ppEVar18)->field_0 + 0x28) != 0) ||
         (((*ppEVar18)->field_0)._impl_.verification_ == 0)) {
        pcVar16 = (field->all_names_).payload_;
        uVar13 = (ulong)*(ushort *)(pcVar16 + 2);
        pcVar16 = pcVar16 + ~uVar13;
        local_80._32_8_ = local_80;
        pcStack_58 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__1,std::__cxx11::string>
        ;
        pcVar20 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__1,std::__cxx11::string>
        ;
LAB_00225a90:
        local_80._0_8_ = &local_98;
        make_error.invoker_ = pcVar20;
        make_error.ptr_.obj = local_80;
        element_name_07._M_str = pcVar16;
        element_name_07._M_len = uVar13;
        AddError(this,element_name_07,&proto->super_Message,EXTENDEE,make_error);
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const FieldDescriptor* field,
                                        const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }

  ValidateFieldFeatures(field, proto);

  if (field->file()->edition() >= Edition::EDITION_2024 &&
      field->has_legacy_proto_ctype()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "ctype option is not allowed under edition 2024 and beyond. Use "
             "the feature string_type = VIEW|CORD|STRING|... instead.");
  }

  // Only message type fields may be lazy.
  if (field->options().lazy() || field->options().unverified_lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if ((field->is_required() || field->is_repeated()) ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (calculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // a user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

  if (absl::StrContains(field->json_name(), '\0')) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "json_name cannot have embedded null characters.");
  }


  // If this is a declared extension, validate that the actual name and type
  // match the declaration.
  if (field->is_extension()) {
    if (pool_->IsReadyForCheckingDescriptorExtDecl(
            field->containing_type()->full_name())) {
      return;
    }
    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range->options_ == nullptr) {
      return;
    }

    if (pool_->EnforceCustomExtensionDeclarations()) {
      for (const auto& declaration : extension_range->options_->declaration()) {
        if (declaration.number() != field->number()) continue;
        if (declaration.reserved()) {
          AddError(
              field->full_name(), proto,
              DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                return absl::Substitute(
                    "Cannot use number $0 for extension field $1, as it is "
                    "reserved in the extension declarations for message $2.",
                    field->number(), field->full_name(),
                    field->containing_type()->full_name());
              });
          return;
        }
        CheckExtensionDeclaration(*field, proto, declaration.full_name(),
                                  declaration.type(), declaration.repeated());
        return;
      }

      // Either no declarations, or there are but no matches. If there are no
      // declarations, we check its verification state. If there are other
      // non-matching declarations, we enforce that this extension must also be
      // declared.
      if (!extension_range->options_->declaration().empty() ||
          (extension_range->options_->verification() ==
           ExtensionRangeOptions::DECLARATION)) {
        AddError(
            field->full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
            [&] {
              return absl::Substitute(
                  "Missing extension declaration for field $0 with number $1 "
                  "in extendee message $2. An extension range must declare for "
                  "all extension fields if its verification state is "
                  "DECLARATION or there's any declaration in the range "
                  "already. Otherwise, consider splitting up the range.",
                  field->full_name(), field->number(),
                  field->containing_type()->full_name());
            });
        return;
      }
    }
  }
}